

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O0

void __thiscall pg::TSPMSolver::update(TSPMSolver *this,int pl)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  reference pvVar8;
  ostream *poVar9;
  char *pcVar10;
  int local_ac;
  int local_a8;
  int i_2;
  int i_1;
  int to;
  int *curedge_1;
  int local_90;
  int d;
  int best_to;
  int m;
  int *curedge;
  int n;
  value_type local_6c;
  undefined1 local_68 [4];
  int i;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int pl_local;
  TSPMSolver *this_local;
  
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node.
  _4_4_ = pl;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_68);
  for (local_6c = 0; lVar6 = (long)local_6c, lVar7 = Solver::nodecount(&this->super_Solver),
      lVar6 < lVar7; local_6c = local_6c + 1) {
    bVar3 = bitset::operator[]((this->super_Solver).disabled,(long)local_6c);
    if ((!bVar3) &&
       ((this->unstable[local_6c] = 0,
        this->pms[this->k * (long)local_6c +
                  (long)(int)q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_node._4_4_] == -1 ||
        (bVar3 = canlift(this,local_6c,
                         q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node._4_4_), bVar3)))) {
      this->unstable[local_6c] = 1;
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68,&local_6c);
    }
  }
  do {
    bVar3 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      for (local_ac = 0; lVar6 = Solver::nodecount(&this->super_Solver), local_ac < lVar6;
          local_ac = local_ac + 1) {
        bVar3 = bitset::operator[]((this->super_Solver).disabled,(long)local_ac);
        if (((!bVar3) && (this->unstable[local_ac] == 0)) &&
           (this->pms[(this->k * (long)local_ac + 1) -
                      (long)(int)q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_node._4_4_] != -1)) {
          uVar4 = Solver::priority(&this->super_Solver,local_ac);
          if ((uVar4 & 1) !=
              q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node._4_4_) {
            piVar2 = this->counts;
            iVar5 = Solver::priority(&this->super_Solver,local_ac);
            piVar2[iVar5] = piVar2[iVar5] + -1;
          }
          this->pms[(this->k * (long)local_ac -
                    (long)(int)q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_node._4_4_) + 1] = -1;
          todo_push(this,local_ac);
          if ((this->super_Solver).trace != 0) {
            poVar9 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mupdated node ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_ac);
            poVar9 = std::operator<<(poVar9,"/");
            iVar5 = Solver::priority(&this->super_Solver,local_ac);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
            iVar5 = Solver::owner(&this->super_Solver,local_ac);
            pcVar10 = " (even)";
            if (iVar5 != 0) {
              pcVar10 = " (odd)";
            }
            poVar9 = std::operator<<(poVar9,pcVar10);
            std::operator<<(poVar9,"\x1b[m to");
            pm_stream(this,(this->super_Solver).logger,this->pms + (long)local_ac * this->k);
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
      return;
    }
    pvVar8 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    curedge._0_4_ = *pvVar8;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    for (_best_to = Solver::ins(&this->super_Solver,(value_type)curedge); *_best_to != -1;
        _best_to = _best_to + 1) {
      d = *_best_to;
      bVar3 = bitset::operator[]((this->super_Solver).disabled,(long)d);
      if ((!bVar3) && (this->unstable[d] == 0)) {
        uVar4 = Solver::owner(&this->super_Solver,d);
        if (uVar4 != q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                     ._M_finish._M_node._4_4_) {
          local_90 = -1;
          iVar5 = Solver::priority(&this->super_Solver,d);
          for (_i_1 = Solver::outs(&this->super_Solver,d); *_i_1 != -1; _i_1 = _i_1 + 1) {
            iVar1 = *_i_1;
            bVar3 = bitset::operator[]((this->super_Solver).disabled,(long)iVar1);
            if (((!bVar3) && (this->unstable[iVar1] == 0)) &&
               ((Prog(this,this->tmp,this->pms + this->k * (long)iVar1,iVar5,
                      q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node._4_4_), local_90 == -1 ||
                (bVar3 = pm_less(this,this->tmp,this->best,iVar5,
                                 q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_node._4_4_), bVar3)))) {
              for (local_a8 = 0; local_90 = iVar1, (long)local_a8 < this->k; local_a8 = local_a8 + 1
                  ) {
                this->best[local_a8] = this->tmp[local_a8];
              }
            }
          }
          if ((local_90 != -1) &&
             (bVar3 = pm_less(this,this->pms + this->k * (long)d,this->best,iVar5,
                              q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node._4_4_), !bVar3))
          goto LAB_002186f3;
        }
        this->unstable[d] = 1;
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68,&d);
      }
LAB_002186f3:
    }
  } while( true );
}

Assistant:

void
TSPMSolver::update(int pl)
{
    std::queue<int> q;

    // find unstable nodes (for measure <pl>)
    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        unstable[i] = 0; // first mark as stable
        if (pms[k*i + pl] == -1 or canlift(i, pl)) {
            unstable[i] = 1;
            q.push(i);
        }
    }

    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int m = *curedge;
            if (disabled[m] or unstable[m]) continue;
            if (owner(m) != pl) {
                int best_to = -1;
                const int d = priority(m);
                for (auto curedge = outs(m); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (disabled[to]) continue;
                    if (unstable[to]) continue;
                    Prog(tmp, pms + k*to, d, pl);
                    if (best_to == -1 or pm_less(tmp, best, d, pl)) {
                        for (int i=0; i<k; i++) best[i] = tmp[i];
                        best_to = to;
                    }
                }
                if (best_to != -1 and !pm_less(pms+k*m, best, d, pl)) continue;
            }
            unstable[m] = 1;
            q.push(m);
        }
    }

    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        if (unstable[i] == 0 and pms[k*i + 1-pl] != -1) {
            if ((priority(i)&1) != pl) counts[priority(i)]--;
            pms[k*i + 1-pl] = -1;
            todo_push(i);

            if (trace) {
                logger << "\033[1;33mupdated node " << i << "/" << priority(i) << (owner(i)?" (odd)":" (even)") << "\033[m to";
                pm_stream(logger, pms + i*k);
                logger << std::endl;
            }
        }
    }
}